

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int lnewwriter(lua_State *L)

{
  int32_t sz_00;
  size_t __n;
  int iVar1;
  void *__dest;
  char *__src;
  undefined8 *puVar2;
  undefined8 *puVar3;
  stm_copy *psVar4;
  size_t sz;
  
  iVar1 = lua_isuserdata(L,1);
  if (iVar1 == 0) {
    __src = luaL_checklstring(L,1,&sz);
    __n = sz;
    __dest = malloc(sz);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,1);
    sz = luaL_checkinteger(L,2);
  }
  puVar2 = (undefined8 *)lua_newuserdata(L,8);
  sz_00 = (int32_t)sz;
  puVar3 = (undefined8 *)malloc(0x18);
  *puVar3 = 0;
  *(undefined4 *)(puVar3 + 1) = 1;
  psVar4 = stm_newcopy(__dest,sz_00);
  puVar3[2] = psVar4;
  *puVar2 = puVar3;
  lua_pushvalue(L,-0xf4629);
  lua_setmetatable(L,-2);
  return 1;
}

Assistant:

static int
lnewwriter(lua_State *L) {
	void * msg;
	size_t sz;
	if (lua_isuserdata(L,1)) {
		msg = lua_touserdata(L, 1);
		sz = (size_t)luaL_checkinteger(L, 2);
	} else {
		const char * tmp = luaL_checklstring(L,1,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	struct boxstm * box = lua_newuserdata(L, sizeof(*box));
	box->obj = stm_new(msg,sz);
	lua_pushvalue(L, lua_upvalueindex(1));
	lua_setmetatable(L, -2);

	return 1;
}